

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# currpinf.cpp
# Opt level: O2

void __thiscall
icu_63::CurrencyPluralInfo::CurrencyPluralInfo(CurrencyPluralInfo *this,CurrencyPluralInfo *info)

{
  (this->super_UObject)._vptr_UObject = (_func_int **)&PTR__CurrencyPluralInfo_003ccb78;
  this->fPluralCountToCurrencyUnitPattern = (Hashtable *)0x0;
  this->fPluralRules = (PluralRules *)0x0;
  *(undefined8 *)((long)&this->fPluralRules + 4) = 0;
  *(undefined8 *)((long)&this->fLocale + 4) = 0;
  operator=(this,info);
  return;
}

Assistant:

CurrencyPluralInfo::CurrencyPluralInfo(const CurrencyPluralInfo& info) 
:   UObject(info),
    fPluralCountToCurrencyUnitPattern(nullptr),
    fPluralRules(nullptr),
    fLocale(nullptr),
    fInternalStatus(U_ZERO_ERROR) {
    *this = info;
}